

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.h
# Opt level: O2

void __thiscall Iir::LayoutBase::add(LayoutBase *this,complex_t *pole,complex_t *zero)

{
  complex<double> *pcVar1;
  PoleZeroPair *pPVar2;
  int iVar3;
  PoleZeroPair local_60;
  
  if ((this->m_numPoles & 1) != 0) {
    throw_invalid_argument("Can\'t add 2nd order after a 1st order filter.");
  }
  if ((NAN(*(double *)pole->_M_value)) || (NAN(*(double *)(pole->_M_value + 8)))) {
    throw_invalid_argument("Pole to add is NaN.");
  }
  if ((NAN(*(double *)zero->_M_value)) || (NAN(*(double *)(zero->_M_value + 8)))) {
    throw_invalid_argument("Zero to add is NaN.");
  }
  PoleZeroPair::PoleZeroPair(&local_60,pole,zero);
  pPVar2 = this->m_pair;
  iVar3 = this->m_numPoles / 2;
  *(undefined8 *)pPVar2[iVar3].poles.super_complex_pair_t.first._M_value =
       local_60.poles.super_complex_pair_t.first._M_value._0_8_;
  *(undefined8 *)(pPVar2[iVar3].poles.super_complex_pair_t.first._M_value + 8) =
       local_60.poles.super_complex_pair_t.first._M_value._8_8_;
  pcVar1 = &pPVar2[iVar3].poles.super_complex_pair_t.second;
  *(undefined8 *)pcVar1->_M_value = local_60.poles.super_complex_pair_t.second._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = local_60.poles.super_complex_pair_t.second._M_value._8_8_;
  *(undefined8 *)pPVar2[iVar3].zeros.super_complex_pair_t.first._M_value =
       local_60.zeros.super_complex_pair_t.first._M_value._0_8_;
  *(undefined8 *)(pPVar2[iVar3].zeros.super_complex_pair_t.first._M_value + 8) =
       local_60.zeros.super_complex_pair_t.first._M_value._8_8_;
  pcVar1 = &pPVar2[iVar3].zeros.super_complex_pair_t.second;
  *(undefined8 *)pcVar1->_M_value = local_60.zeros.super_complex_pair_t.second._M_value._0_8_;
  *(undefined8 *)(pcVar1->_M_value + 8) = local_60.zeros.super_complex_pair_t.second._M_value._8_8_;
  this->m_numPoles = this->m_numPoles + 1;
  return;
}

Assistant:

void add (const complex_t& pole, const complex_t& zero)
		{
			if (m_numPoles&1)
				throw_invalid_argument(errCantAdd2ndOrder);
			if (Iir::is_nan(pole))
				throw_invalid_argument(errPoleisNaN);
			if (Iir::is_nan(zero))
				throw_invalid_argument(errZeroisNaN);
			m_pair[m_numPoles/2] = PoleZeroPair (pole, zero);
			++m_numPoles;
		}